

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initRun
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,_run *run
          ,_tessellation_primitive_mode primitive_mode,GLint n_patch_vertices,bool is_indiced,
          GLint n_instances,uint drawcall_count_multiplier)

{
  char cVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *__s;
  TestError *this_00;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  undefined7 in_register_00000081;
  ulong __n;
  GLint link_status;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *local_d0;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  GLfloat tess_levels [4];
  undefined8 local_a0;
  string te_body;
  string tc_body;
  char *varyings [5];
  long lVar5;
  
  run->drawcall_count_multiplier = drawcall_count_multiplier;
  local_d0 = (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *)
             CONCAT44(local_d0._4_4_,(int)CONCAT71(in_register_00000081,is_indiced));
  run->drawcall_is_indiced = is_indiced;
  run->n_instances = n_instances;
  run->n_patch_vertices = n_patch_vertices;
  run->primitive_mode = primitive_mode;
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  run->po_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  pcVar8 = "glCreateProgram() failed";
  glu::checkError(dVar4,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x481);
  getTCCode_abi_cxx11_
            (&tc_body,(TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *)
                      pcVar8,n_patch_vertices);
  tc_body_raw_ptr = tc_body._M_dataplus._M_p;
  GVar3 = (**(code **)(lVar5 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER)
  ;
  run->tc_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x488);
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->tc_id,1,&tc_body_raw_ptr);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  pcVar8 = "glShaderSource() failed for tessellation control shader";
  glu::checkError(dVar4,"glShaderSource() failed for tessellation control shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x48b);
  getTECode_abi_cxx11_
            (&te_body,(TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *)
                      pcVar8,primitive_mode);
  te_body_raw_ptr = te_body._M_dataplus._M_p;
  GVar3 = (**(code **)(lVar5 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  run->te_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x492);
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->te_id,1,&te_body_raw_ptr);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glShaderSource() failed for tessellation evaluation shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x495);
  local_a0._0_4_ = run->tc_id;
  local_a0._4_4_ = run->te_id;
  TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,(GLuint *)&local_a0,true);
  (**(code **)(lVar5 + 0x10))(run->po_id,this->m_fs_id);
  (**(code **)(lVar5 + 0x10))(run->po_id,run->te_id);
  (**(code **)(lVar5 + 0x10))(run->po_id,this->m_vs_id);
  (**(code **)(lVar5 + 0x10))(run->po_id,run->tc_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glAttachShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4a3);
  varyings[4] = "te_primitive_id";
  varyings[2] = "te_tc_primitive_id";
  varyings[3] = "te_patch_vertices_in";
  varyings[0]._0_4_ = 0x17be8b0;
  varyings[0]._4_4_ = 0;
  varyings[1]._0_4_ = 0x17be8c4;
  varyings[1]._4_4_ = 0;
  (**(code **)(lVar5 + 0x14c8))(run->po_id,5,varyings,0x8c8c);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4ab);
  link_status = 0;
  (**(code **)(lVar5 + 0xce8))(run->po_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glLinkProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4b1);
  (**(code **)(lVar5 + 0x9d8))(run->po_id,0x8b82,&link_status);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4b4);
  if (link_status == 1) {
    if ((char)local_d0 != '\0') {
      (**(code **)(lVar5 + 0x6c8))(1,run);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGenBuffers() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4c2);
      tess_levels[0]._0_1_ = 1;
      local_d0 = this;
      (**(code **)(lVar5 + 0x798))(0x8221);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,
                      "glGetIntegerv() failed for GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED pname",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4cc);
      uVar7 = run->n_patch_vertices * 2;
      uVar6 = run->n_patch_vertices * run->drawcall_count_multiplier;
      cVar1 = tess_levels[0]._0_1_;
      if (tess_levels[0]._0_1_ != '\0') {
        run->n_restart_indices = uVar6 / uVar7;
        uVar6 = uVar6 / uVar7 + uVar6;
      }
      __n = (ulong)uVar6;
      __s = operator_new__(__n);
      memset(__s,0,__n);
      this = local_d0;
      if (cVar1 != '\0') {
        iVar2 = uVar7 + 1;
        for (; uVar7 < uVar6; uVar7 = uVar7 + iVar2) {
          *(undefined1 *)((long)__s + (ulong)uVar7) = 0xff;
        }
      }
      (**(code **)(lVar5 + 0x40))(0x8893,run->bo_indices_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindBuffer() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4fc);
      (**(code **)(lVar5 + 0x150))(0x8893,__n,__s,0x88e4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBufferData() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4ff);
      operator_delete__(__s);
    }
    tess_levels[0] = 4.0;
    tess_levels[1] = 4.0;
    tess_levels[2] = 4.0;
    tess_levels[3] = 4.0;
    uVar7 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                      (this->m_utils_ptr,run->primitive_mode,tess_levels,tess_levels,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,false);
    run->n_result_vertices = uVar7 * run->drawcall_count_multiplier * run->n_instances;
    std::__cxx11::string::~string((string *)&te_body);
    std::__cxx11::string::~string((string *)&tc_body);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
             ,0x4b8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initRun(
	_run& run, _tessellation_primitive_mode primitive_mode, glw::GLint n_patch_vertices, bool is_indiced,
	glw::GLint n_instances, unsigned int drawcall_count_multiplier)
{
	run.drawcall_count_multiplier = drawcall_count_multiplier;
	run.drawcall_is_indiced		  = is_indiced;
	run.n_instances				  = n_instances;
	run.n_patch_vertices		  = n_patch_vertices;
	run.primitive_mode			  = primitive_mode;

	/* Set up a program object for the descriptor */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	run.po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Set up tessellation control shader object */
	std::string tc_body			= getTCCode(n_patch_vertices);
	const char* tc_body_raw_ptr = tc_body.c_str();

	run.tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

	shaderSourceSpecialized(run.tc_id, 1 /* count */, &tc_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader");

	/* Set up tessellation evaluation shader object. */
	std::string te_body			= getTECode(primitive_mode);
	const char* te_body_raw_ptr = te_body.c_str();

	run.te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

	shaderSourceSpecialized(run.te_id, 1 /* count */, &te_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader");

	/* Compile the shaders */
	const glw::GLuint  shader_ids[] = { run.tc_id, run.te_id };
	const unsigned int n_shader_ids = sizeof(shader_ids) / sizeof(shader_ids[0]);

	m_utils_ptr->compileShaders(n_shader_ids, shader_ids, true /* should_succeed */);

	/* Attach all shader to the program object */
	gl.attachShader(run.po_id, m_fs_id);
	gl.attachShader(run.po_id, run.te_id);
	gl.attachShader(run.po_id, m_vs_id);
	gl.attachShader(run.po_id, run.tc_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed");

	/* Set up XFB */
	const char* varyings[] = { "te_tc_invocation_id", "te_tc_patch_vertices_in", "te_tc_primitive_id",
							   "te_patch_vertices_in", "te_primitive_id" };
	const unsigned int n_varyings = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(run.po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(run.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

	gl.getProgramiv(run.po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* If this is going to be an indiced draw call, we need to initialize a buffer
	 * object that will hold index data. GL_UNSIGNED_BYTE index type will be always
	 * used for the purpose of this test.
	 */
	if (is_indiced)
	{
		gl.genBuffers(1, &run.bo_indices_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

		/* Implementations are allowed NOT to support primitive restarting for patches.
		 * Take this into account and do not insert restart indices, if ES reports no
		 * support.
		 */
		glw::GLboolean is_primitive_restart_supported = GL_TRUE;

		gl.getBooleanv(GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, &is_primitive_restart_supported);
		GLU_EXPECT_NO_ERROR(gl.getError(),
							"glGetIntegerv() failed for GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED pname");

		/* Set up index buffer storage. Note that we're not using any attributes
		 * in any stage - our goal is just to make sure the primitive counter does
		 * not restart whenever restart index is encountered during a draw call */
		DE_ASSERT(run.n_patch_vertices > 3);
		DE_ASSERT(run.drawcall_count_multiplier > 1);

		const unsigned int interleave_rate = run.n_patch_vertices * 2;
		unsigned char*	 bo_contents	 = DE_NULL;
		unsigned int	   bo_size =
			static_cast<unsigned int>(sizeof(unsigned char) * run.n_patch_vertices * run.drawcall_count_multiplier);

		/* Count in restart indices if necessary */
		if (is_primitive_restart_supported)
		{
			run.n_restart_indices = (bo_size / interleave_rate);
			bo_size += 1 /* restart index */ * run.n_restart_indices;
		}

		/* Allocate space for the index buffer */
		bo_contents = new unsigned char[bo_size];

		/* Interleave the restart index every two complete sets of vertices, each set
		 * making up a full set of vertices. Fill all other indices with zeros. The
		 * indices don't really matter since test shaders do not use any attributes -
		 * what we want to verify is that the restart index does not break the primitive
		 * id counter.
		 *
		 * NOTE: Our interleave rate is just an arbitrary value that makes
		 *       sense, given the multipliers we use for the test */
		const unsigned char restart_index = 0xFF;

		memset(bo_contents, 0, bo_size);

		if (is_primitive_restart_supported)
		{
			for (unsigned int n_index = interleave_rate; n_index < bo_size; n_index += interleave_rate)
			{
				bo_contents[n_index] = restart_index;

				/* Move one index ahead */
				n_index++;
			}
		}

		/* Set up the buffer object storage */
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, run.bo_indices_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, bo_size, bo_contents, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		/* Release the buffer */
		delete[] bo_contents;

		bo_contents = NULL;
	}

	/* Retrieve amount of tessellation coordinates.
	 *
	 * Note: this test assumes a constant tessellation level value of 4 for all
	 *       inner/outer tessellation levels */
	const glw::GLfloat tess_levels[] = { 4.0f, 4.0f, 4.0f, 4.0f };

	run.n_result_vertices = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
		run.primitive_mode, tess_levels, tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		false); /* is_point_mode_enabled */

	/* The value we have at this point is for single patch only. To end up
	 * with actual amount of coordinates that will be generated by the tessellator,
	 * we need to multiply it by drawcall_count_multiplier * n_instances */
	run.n_result_vertices *= run.drawcall_count_multiplier * run.n_instances;

	/* We're done! */
}